

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O3

bool CScript::IsPayToAnchor
               (int version,vector<unsigned_char,_std::allocator<unsigned_char>_> *program)

{
  pointer puVar1;
  long in_FS_OFFSET;
  bool bVar2;
  
  if (((version == 1) &&
      (puVar1 = (program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                .super__Vector_impl_data._M_start,
      (long)(program->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 == 2)) && (*puVar1 == 'N')) {
    bVar2 = puVar1[1] == 's';
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool CScript::IsPayToAnchor(int version, const std::vector<unsigned char>& program)
{
    return version == 1 &&
        program.size() == 2 &&
        program[0] == 0x4e &&
        program[1] == 0x73;
}